

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Glucose::SimpSolver::eliminateVar(SimpSolver *this,Var v)

{
  vec<Glucose::Lit> *out_clause;
  ulong *puVar1;
  uint *puVar2;
  uint *puVar3;
  Var v_00;
  uint *puVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  vec<unsigned_int> *pvVar8;
  int i;
  long lVar9;
  Lit x;
  vec<Glucose::Solver::Watcher> *pvVar10;
  int j;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int i_1;
  int iVar14;
  ulong uVar15;
  Var v_local;
  vec<unsigned_int> *local_88;
  int clause_size;
  vec<unsigned_int> neg;
  vec<unsigned_int> pos;
  
  v_local = v;
  local_88 = OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::lookup
                       (&this->occurs,&v_local);
  pos.data = (uint *)0x0;
  pos.sz = 0;
  pos.cap = 0;
  neg.data = (uint *)0x0;
  neg.sz = 0;
  neg.cap = 0;
  lVar9 = 0;
  do {
    puVar4 = pos.data;
    puVar3 = neg.data;
    v_00 = v_local;
    if (local_88->sz <= lVar9) {
      clause_size = 0;
      lVar9 = (long)v_local;
      uVar15 = 0;
      uVar13 = neg._8_8_ & 0xffffffff;
      if (neg.sz < 1) {
        uVar13 = uVar15;
      }
      uVar7 = pos._8_8_ & 0xffffffff;
      if (pos.sz < 1) {
        uVar7 = uVar15;
      }
      iVar14 = 0;
      for (; uVar15 != uVar7; uVar15 = uVar15 + 1) {
        for (uVar11 = 0; uVar13 != uVar11; uVar11 = uVar11 + 1) {
          puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
          bVar5 = merge(this,(Clause *)(puVar2 + puVar4[uVar15]),(Clause *)(puVar2 + puVar3[uVar11])
                        ,v_00,&clause_size);
          if (bVar5) {
            bVar5 = true;
            if (this->grow + local_88->sz <= iVar14) goto LAB_00116475;
            iVar14 = iVar14 + 1;
            if ((this->clause_lim != -1) && (this->clause_lim < clause_size)) goto LAB_00116475;
          }
        }
      }
      (this->eliminated).data[lVar9] = '\x01';
      Solver::setDecisionVar(&this->super_Solver,v_local,false);
      this->eliminated_vars = this->eliminated_vars + 1;
      pvVar8 = &this->elimclauses;
      lVar9 = 0;
      if (neg.sz < pos.sz) {
        for (; lVar9 < neg.sz; lVar9 = lVar9 + 1) {
          mkElimClause(pvVar8,v_local,
                       (Clause *)
                       ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                       neg.data[lVar9]));
        }
        x.x = v_local * 2;
      }
      else {
        for (; lVar9 < pos.sz; lVar9 = lVar9 + 1) {
          mkElimClause(pvVar8,v_local,
                       (Clause *)
                       ((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                       pos.data[lVar9]));
        }
        x.x = v_local * 2 + 1;
      }
      mkElimClause(pvVar8,x);
      out_clause = &(this->super_Solver).add_tmp;
      lVar9 = 0;
      pvVar8 = local_88;
      do {
        if (pos.sz <= lVar9) {
          for (lVar9 = 0; lVar9 < pvVar8->sz; lVar9 = lVar9 + 1) {
            removeClause(this,pvVar8->data[lVar9],false);
            pvVar8 = local_88;
          }
          vec<unsigned_int>::clear((this->occurs).occs.data + v_local,true);
          pvVar10 = (this->super_Solver).watches.occs.data;
          if (pvVar10[(long)v_local * 2].sz == 0) {
            vec<Glucose::Solver::Watcher>::clear(pvVar10 + (long)v_local * 2,true);
            pvVar10 = (this->super_Solver).watches.occs.data;
          }
          uVar6 = v_local * 2 | 1;
          if (pvVar10[(int)uVar6].sz == 0) {
            vec<Glucose::Solver::Watcher>::clear(pvVar10 + (int)uVar6,true);
          }
          bVar5 = backwardSubsumptionCheck(this,false);
LAB_00116475:
          vec<unsigned_int>::~vec(&neg);
          vec<unsigned_int>::~vec(&pos);
          return bVar5;
        }
        for (lVar12 = 0; lVar12 < neg.sz; lVar12 = lVar12 + 1) {
          puVar3 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
          bVar5 = merge(this,(Clause *)(puVar3 + pos.data[lVar9]),
                        (Clause *)(puVar3 + neg.data[lVar12]),v_local,out_clause);
          if ((bVar5) &&
             (iVar14 = (*(this->super_Solver).super_Clone._vptr_Clone[4])(this,out_clause),
             (char)iVar14 == '\0')) {
            bVar5 = false;
            goto LAB_00116475;
          }
          pvVar8 = local_88;
        }
        lVar9 = lVar9 + 1;
      } while( true );
    }
    puVar1 = (ulong *)((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory +
                      local_88->data[lVar9]);
    uVar13 = *puVar1;
    uVar15 = uVar13 >> 0x20;
    if ((int)(uVar13 >> 0x20) == 0 || (long)uVar13 < 0) {
      uVar15 = 0;
    }
    uVar7 = 0xffffffffffffffff;
    do {
      uVar11 = uVar15;
      if (uVar7 - uVar15 == -1) break;
      uVar11 = uVar7 + 1;
      lVar12 = uVar7 * 4;
      uVar7 = uVar11;
    } while (*(int *)((long)puVar1 + lVar12 + 0x10) != v_local * 2);
    pvVar8 = &neg;
    if ((long)uVar11 < (long)uVar13 >> 0x20) {
      pvVar8 = &pos;
    }
    vec<unsigned_int>::push(pvVar8,local_88->data + lVar9);
    lVar9 = lVar9 + 1;
  } while( true );
}

Assistant:

bool SimpSolver::eliminateVar(Var v)
{
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    // Split the occurrences into positive and negative:
    //
    const vec<CRef>& cls = occurs.lookup(v);
    vec<CRef>        pos, neg;
    for (int i = 0; i < cls.size(); i++)
        (find(ca[cls[i]], mkLit(v)) ? pos : neg).push(cls[i]);

    // Check wether the increase in number of clauses stays within the allowed ('grow'). Moreover, no
    // clause must exceed the limit on the maximal clause size (if it is set):
    //
    int cnt         = 0;
    int clause_size = 0;

    for (int i = 0; i < pos.size(); i++)
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, clause_size) && 
                (++cnt > cls.size() + grow || (clause_lim != -1 && clause_size > clause_lim)))
                return true;

    // Delete and store old clauses
    eliminated[v] = true;
    setDecisionVar(v, false);
    eliminated_vars++;

    if (pos.size() > neg.size()){
        for (int i = 0; i < neg.size(); i++)
            mkElimClause(elimclauses, v, ca[neg[i]]);
        mkElimClause(elimclauses, mkLit(v));
    }else{
        for (int i = 0; i < pos.size(); i++)
            mkElimClause(elimclauses, v, ca[pos[i]]);
        mkElimClause(elimclauses, ~mkLit(v));
    }


    // Produce clauses in cross product:
    vec<Lit>& resolvent = add_tmp;
    for (int i = 0; i < pos.size(); i++)
        for (int j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, resolvent) && !addClause_(resolvent))
                return false;

    for (int i = 0; i < cls.size(); i++)
        removeClause(cls[i]);

    // Free occurs list for this variable:
    occurs[v].clear(true);

    // Free watchers lists for this variable, if possible:
    if (watches[ mkLit(v)].size() == 0) watches[ mkLit(v)].clear(true);
    if (watches[~mkLit(v)].size() == 0) watches[~mkLit(v)].clear(true);

    return backwardSubsumptionCheck();
}